

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

double __thiscall
pbrt::funcs::gaussian::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,double x,double mu,double sigma)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  dVar1 = ::sqrt(in_XMM2_Qa * 6.2831854820251465 * in_XMM2_Qa);
  dVar2 = Sqr<double>(in_XMM0_Qa - in_XMM1_Qa);
  dVar2 = exp(-dVar2 / (in_XMM2_Qa * 2.0 * in_XMM2_Qa));
  return (1.0 / dVar1) * dVar2;
}

Assistant:

static double gaussian(Point2f p) {
    auto Gaussian = [](double x, double mu = 0, double sigma = 1) {
        return 1 / std::sqrt(2 * Pi * sigma * sigma) *
               std::exp(-Sqr(x - mu) / (2 * sigma * sigma));
    };
    auto GaussianIntegral = [](double x0, double x1, double mu = 0, double sigma = 1) {
        double sigmaRoot2 = sigma * double(1.414213562373095);
        return 0.5f *
               (std::erf((mu - x0) / sigmaRoot2) - std::erf((mu - x1) / sigmaRoot2));
    };

    double mu = 0.5, sigma = 0.25;
    static double nrm = Sqr(GaussianIntegral(0, 1, mu, sigma));
    return Gaussian(p.x, mu, sigma) * Gaussian(p.y, mu, sigma) / nrm;
}